

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

_Bool file_newer(char *first,char *second)

{
  int iVar1;
  undefined1 local_140 [8];
  stat stat2;
  stat stat1;
  char *second_local;
  char *first_local;
  
  iVar1 = stat(first,(stat *)(stat2.__glibc_reserved + 2));
  if (iVar1 == 0) {
    iVar1 = stat(second,(stat *)local_140);
    if (iVar1 == 0) {
      first_local._7_1_ = stat2.st_atim.tv_nsec < stat1.st_atim.tv_nsec;
    }
    else {
      first_local._7_1_ = true;
    }
  }
  else {
    first_local._7_1_ = false;
  }
  return first_local._7_1_;
}

Assistant:

bool file_newer(const char *first, const char *second)
{
#ifdef HAVE_STAT
	struct stat stat1, stat2;

	/* If the first doesn't exist, the first is not newer. */
	if (stat(first, &stat1) != 0) return false;

	/* If the second doesn't exist, the first is always newer. */
	if (stat(second, &stat2) != 0) return true;

	/* Compare modification times. */
	return stat1.st_mtime > stat2.st_mtime ? true : false;
#else /* HAVE_STAT */
	return false;
#endif /* !HAVE_STAT */
}